

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::DefineCachedFunctions(ByteCodeGenerator *this,FuncInfo *funcInfoParent)

{
  ParseNodeFnc *pnodeScope;
  anon_class_24_3_523878ff fn;
  anon_class_24_3_2205aa9a fn_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  AuxArray<Js::FuncInfoEntry> *this_00;
  FunctionBody *this_01;
  anon_class_24_3_2205aa9a defineOrGetCachedFunc;
  anon_class_24_3_523878ff fillEntries;
  AuxArray<unsigned_int> *slotIdInCachedScopeToNestedIndexArray;
  TrackAllocData local_78;
  AuxArray<Js::FuncInfoEntry> *local_50;
  FuncInfoArray *info;
  int iStack_40;
  int extraBytes;
  size_t extraBytesActual;
  uint *local_30;
  anon_class_8_1_3cff8c51 countFncSlots;
  uint slotCount;
  ParseNode *pnodeParent;
  FuncInfo *funcInfoParent_local;
  ByteCodeGenerator *this_local;
  
  pnodeScope = funcInfoParent->root;
  countFncSlots.slotCount._4_4_ = 0;
  extraBytesActual = (long)&countFncSlots.slotCount + 4;
  local_30 = (uint *)extraBytesActual;
  pnodeParent = (ParseNode *)funcInfoParent;
  funcInfoParent_local = (FuncInfo *)this;
  MapContainerScopeFunctions<ByteCodeGenerator::DefineCachedFunctions(FuncInfo*)::__0>
            (&pnodeScope->super_ParseNode,(anon_class_8_1_3cff8c51)extraBytesActual);
  if (countFncSlots.slotCount._4_4_ != 0) {
    _iStack_40 = AllocSizeMath::Mul((ulong)countFncSlots.slotCount._4_4_,8);
    if (0x7fffffff < _iStack_40) {
      Js::Throw::OutOfMemory();
    }
    info._4_4_ = iStack_40;
    pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_78,(type_info *)&Js::AuxArray<Js::FuncInfoEntry>::typeinfo,(long)iStack_40,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
               ,0x431);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_78);
    this_00 = (AuxArray<Js::FuncInfoEntry> *)
              new<Memory::ArenaAllocator>(4,(ArenaAllocator *)pAVar1,0x3f67b0,0);
    Js::AuxArray<Js::FuncInfoEntry>::AuxArray(this_00,countFncSlots.slotCount._4_4_);
    local_50 = this_00;
    this_01 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pnodeParent);
    fillEntries.slotIdInCachedScopeToNestedIndexArray =
         (AuxArray<unsigned_int> **)
         Js::FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray
                   (this_01,countFncSlots.slotCount._4_4_);
    countFncSlots.slotCount._4_4_ = 0;
    fillEntries.info = (FuncInfoArray **)((long)&countFncSlots.slotCount + 4);
    fillEntries.slotCount = (uint *)&fillEntries.slotIdInCachedScopeToNestedIndexArray;
    fn.slotCount = (uint *)fillEntries.info;
    fn.info = &local_50;
    fn.slotIdInCachedScopeToNestedIndexArray = (AuxArray<unsigned_int> **)fillEntries.slotCount;
    MapContainerScopeFunctions<ByteCodeGenerator::DefineCachedFunctions(FuncInfo*)::__1>
              (&pnodeScope->super_ParseNode,fn);
    Js::ByteCodeWriter::AuxNoReg
              (&this->m_writer,InitCachedFuncs,local_50,info._4_4_ + 4,info._4_4_ + 4);
    countFncSlots.slotCount._4_4_ = 0;
    fn_00.funcInfoParent = (FuncInfo **)&pnodeParent;
    fn_00.this = this;
    fn_00.slotCount = (uint *)((long)&countFncSlots.slotCount + 4);
    MapContainerScopeFunctions<ByteCodeGenerator::DefineCachedFunctions(FuncInfo*)::__2>
              (&pnodeScope->super_ParseNode,fn_00);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<Js::FuncInfoEntry>>
              (this->alloc,local_50,(long)info._4_4_);
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineCachedFunctions(FuncInfo *funcInfoParent)
{
    ParseNode *pnodeParent = funcInfoParent->root;
    uint slotCount = 0;

    auto countFncSlots = [&](ParseNode *pnodeFnc)
    {
        if (pnodeFnc->AsParseNodeFnc()->GetFuncSymbol() != nullptr && pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, countFncSlots);

    if (slotCount == 0)
    {
        return;
    }

    size_t extraBytesActual = AllocSizeMath::Mul(slotCount, sizeof(Js::FuncInfoEntry));
    // Reg2Aux takes int for byteCount so we need to convert to int. OOM if we can't because it would truncate data.
    if (extraBytesActual > INT_MAX)
    {
        Js::Throw::OutOfMemory();
    }
    int extraBytes = (int)extraBytesActual;

    Js::FuncInfoArray *info = AnewPlus(alloc, extraBytes, Js::FuncInfoArray, slotCount);

    // slotCount is guaranteed to be non-zero here.
    Js::AuxArray<uint32> * slotIdInCachedScopeToNestedIndexArray = funcInfoParent->GetParsedFunctionBody()->AllocateSlotIdInCachedScopeToNestedIndexArray(slotCount);

    slotCount = 0;

    auto fillEntries = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (sym != nullptr && (pnodeFnc->AsParseNodeFnc()->IsDeclaration() || pnodeFnc->AsParseNodeFnc()->IsDefaultModuleExport()))
        {
            AssertMsg(!pnodeFnc->AsParseNodeFnc()->IsGenerator(), "Generator functions are not supported by InitCachedFuncs but since they always escape they should disable function caching");
            Js::FuncInfoEntry *entry = &info->elements[slotCount];
            entry->nestedIndex = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            entry->scopeSlot = sym->GetScopeSlot();

            slotIdInCachedScopeToNestedIndexArray->elements[slotCount] = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, fillEntries);

    m_writer.AuxNoReg(Js::OpCode::InitCachedFuncs,
        info,
        sizeof(Js::FuncInfoArray) + extraBytes,
        sizeof(Js::FuncInfoArray) + extraBytes);

    slotCount = 0;
    auto defineOrGetCachedFunc = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            // Do we need to define the function here (i.e., is it not one of our cached locals)?
            // Only happens if the sym is null (e.g., function x.y(){}).
            if (sym == nullptr)
            {
                this->DefineOneFunction(pnodeFnc->AsParseNodeFnc(), funcInfoParent);
            }
            else if (!sym->IsInSlot(this, funcInfoParent) && sym->GetLocation() != Js::Constants::NoRegister)
            {
                // If it was defined by InitCachedFuncs, do we need to put it in a register rather than a slot?
                m_writer.Reg1Unsigned1(Js::OpCode::GetCachedFunc, sym->GetLocation(), slotCount);
            }
            // The "x = function() {...}" case is being generated on the fly, during emission,
            // so the caller expects to be able to release this register.
            funcInfoParent->ReleaseLoc(pnodeFnc);
            pnodeFnc->location = Js::Constants::NoRegister;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, defineOrGetCachedFunc);

    AdeletePlus(alloc, extraBytes, info);
}